

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
IntrusiveListTest_insert_pointer_Test::TestBody(IntrusiveListTest_insert_pointer_Test *this)

{
  initializer_list<int> __l;
  allocator<int> local_131;
  int local_130 [4];
  iterator local_120;
  size_type local_118;
  vector<int,_std::allocator<int>_> local_110;
  iterator local_f8;
  int local_e4;
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  local_e0;
  iterator local_d8;
  iterator local_c8;
  int local_b4;
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  local_b0;
  iterator local_a8;
  iterator local_98;
  iterator local_88;
  int local_74;
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  local_70;
  iterator local_68;
  iterator local_58;
  int local_44;
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  local_40;
  iterator local_38;
  undefined1 local_28 [8];
  TestObjectList list;
  IntrusiveListTest_insert_pointer_Test *this_local;
  
  list.size_ = (size_t)this;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_38 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_44 = 2;
  wabt::MakeUnique<(anonymous_namespace)::TestObject,int>((wabt *)&local_40,&local_44);
  local_58 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::insert
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,local_38,
                        &local_40);
  std::
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  ::~unique_ptr(&local_40);
  local_68 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::end
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_74 = 4;
  wabt::MakeUnique<(anonymous_namespace)::TestObject,int>((wabt *)&local_70,&local_74);
  local_88 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::insert
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,local_68,
                        &local_70);
  std::
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  ::~unique_ptr(&local_70);
  local_a8 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_98 = std::next<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>
                       (local_a8,1);
  local_b4 = 3;
  wabt::MakeUnique<(anonymous_namespace)::TestObject,int>((wabt *)&local_b0,&local_b4);
  local_c8 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::insert
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,local_98,
                        &local_b0);
  std::
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  ::~unique_ptr(&local_b0);
  local_d8 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_e4 = 1;
  wabt::MakeUnique<(anonymous_namespace)::TestObject,int>((wabt *)&local_e0,&local_e4);
  local_f8 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::insert
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,local_d8,
                        &local_e0);
  std::
  unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
  ::~unique_ptr(&local_e0);
  local_130[0] = 1;
  local_130[1] = 2;
  local_130[2] = 3;
  local_130[3] = 4;
  local_120 = local_130;
  local_118 = 4;
  std::allocator<int>::allocator(&local_131);
  __l._M_len = local_118;
  __l._M_array = local_120;
  std::vector<int,_std::allocator<int>_>::vector(&local_110,__l,&local_131);
  anon_unknown.dwarf_4f553::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_110);
  std::vector<int,_std::allocator<int>_>::~vector(&local_110);
  std::allocator<int>::~allocator(&local_131);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, insert_pointer) {
  TestObjectList list;

  list.insert(list.begin(), MakeUnique<TestObject>(2));
  list.insert(list.end(), MakeUnique<TestObject>(4));
  list.insert(std::next(list.begin()), MakeUnique<TestObject>(3));
  list.insert(list.begin(), MakeUnique<TestObject>(1));

  AssertListEq(list, {1, 2, 3, 4});
}